

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

JavascriptString *
Js::JavascriptArray::ToLocaleString<Js::JavascriptArray>
          (JavascriptArray *arr,ScriptContext *scriptContext)

{
  bool bVar1;
  BOOL BVar2;
  TypedArrayBase *pTVar3;
  Type TVar4;
  anon_class_48_6_399da0b0 local_b0;
  anon_class_24_3_633237ca local_80;
  undefined1 local_68 [8];
  JsReentLock jsReentLock;
  JavascriptArray *arr_local;
  JavascriptString *res;
  ScriptContext *scriptContext_local;
  bool pushedObject;
  
  local_68 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_68)->noJsReentrancy;
  ((ThreadContext *)local_68)->noJsReentrancy = true;
  jsReentLock._24_8_ = arr;
  res = (JavascriptString *)scriptContext;
  JsReentLock::setObjectForMutation((JsReentLock *)local_68,arr);
  bVar1 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>((RecyclableObject *)arr);
  if (bVar1) {
    pTVar3 = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>((RecyclableObject *)arr);
    if (pTVar3 == (TypedArrayBase *)0x0) goto LAB_00b95113;
    TVar4 = (pTVar3->super_ArrayBufferParent).super_ArrayObject.length;
    scriptContext_local._0_4_ = TVar4;
  }
  else {
LAB_00b95113:
    *(undefined1 *)((long)local_68 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    TVar4 = (arr->super_ArrayObject).length;
    scriptContext_local._0_4_ = TVar4;
    JsReentLock::MutateArrayObject((JsReentLock *)local_68);
    *(bool *)((long)local_68 + 0x108) = true;
  }
  if (TVar4 != 0) {
    BVar2 = ScriptContext::CheckObject(scriptContext,arr);
    if (BVar2 == 0) {
      arr_local = (JavascriptArray *)
                  JavascriptLibrary::GetEmptyString
                            ((scriptContext->super_ScriptContextBase).javascriptLibrary);
      local_b0.res = (JavascriptString **)&arr_local;
      local_b0.pushedObject = (bool *)((long)&scriptContext_local + 7);
      scriptContext_local._7_1_ = 0;
      local_b0.scriptContext = (ScriptContext **)&res;
      local_b0.arr = (JavascriptArray **)&jsReentLock.m_savedNoJsReentrancy;
      local_b0.length = (uint32 *)&scriptContext_local;
      local_b0.jsReentLock = (JsReentLock *)local_68;
      local_80.pushedObject = local_b0.pushedObject;
      local_80.scriptContext = local_b0.scriptContext;
      local_80.arr = local_b0.arr;
      TryFinally<Js::JavascriptArray::ToLocaleString<Js::JavascriptArray>(Js::JavascriptArray*,Js::ScriptContext*)::_lambda()_1_,Js::JavascriptArray::ToLocaleString<Js::JavascriptArray>(Js::JavascriptArray*,Js::ScriptContext*)::_lambda(bool)_1_>
                (&local_b0,&local_80);
      if (arr_local == (JavascriptArray *)0x0) {
        arr_local = (JavascriptArray *)
                    JavascriptLibrary::GetEmptyString
                              ((JavascriptLibrary *)(res->super_RecyclableObject).type.ptr);
      }
      goto LAB_00b95158;
    }
  }
  arr_local = (JavascriptArray *)
              JavascriptLibrary::GetEmptyString
                        ((scriptContext->super_ScriptContextBase).javascriptLibrary);
LAB_00b95158:
  *(undefined1 *)((long)local_68 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return (JavascriptString *)arr_local;
}

Assistant:

JavascriptString* JavascriptArray::ToLocaleString(T* arr, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, arr);

        uint32 length = 0;
        TypedArrayBase * typedArray = JavascriptOperators::TryFromVar<Js::TypedArrayBase>(static_cast<RecyclableObject*>(arr));
        if (typedArray)
        {
            // For a TypedArray use the actual length of the array.
            length = typedArray->GetLength();
        }
        else
        {
            //For anything else, use the "length" property if present.
            JS_REENTRANT(jsReentLock, length = ItemTrace<T>::GetLength(arr, scriptContext));
        }

        if (length == 0 || scriptContext->CheckObject(arr))
        {
            return scriptContext->GetLibrary()->GetEmptyString();
        }

        JavascriptString* res = scriptContext->GetLibrary()->GetEmptyString();
        bool pushedObject = false;

        TryFinally([&]()
        {
            scriptContext->PushObject(arr);
            pushedObject = true;

            Var element;
            JS_REENTRANT(jsReentLock, BOOL gotItem = ItemTrace<T>::GetItem(arr, 0, &element, scriptContext));
            if (gotItem)
            {
                JS_REENTRANT(jsReentLock, res = JavascriptArray::ToLocaleStringHelper(element, scriptContext));
            }

            if (length > 1)
            {
                uint32 sepSize = 0;
                char16 szSeparator[Arrays::SeparatorBufferSize];

                bool hasLocaleSeparator = Arrays::GetLocaleSeparator(szSeparator, &sepSize, Arrays::SeparatorBufferSize);

                JavascriptString* separator = nullptr;

                if (hasLocaleSeparator)
                {
                    separator = JavascriptString::NewCopyBuffer(szSeparator, static_cast<charcount_t>(sepSize), scriptContext);
                }
                else
                {
                    separator = scriptContext->GetLibrary()->GetCommaDisplayString();
                }

                for (uint32 i = 1; i < length; i++)
                {
                    res = JavascriptString::Concat(res, separator);
                    JS_REENTRANT(jsReentLock, gotItem = ItemTrace<T>::GetItem(arr, i, &element, scriptContext));
                    if (gotItem)
                    {
                        JS_REENTRANT(jsReentLock, res = JavascriptString::Concat(res, JavascriptArray::ToLocaleStringHelper(element, scriptContext)));
                    }
                }
            }
        },
        [&](bool/*hasException*/)
        {
            if (pushedObject)
            {
                Var top = scriptContext->PopObject();
                AssertMsg(top == arr, "Unmatched operation stack");
            }
        });

        if (res == nullptr)
        {
            res = scriptContext->GetLibrary()->GetEmptyString();
        }

        return res;
    }